

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

bool __thiscall QWizard::validateCurrentPage(QWizard *this)

{
  undefined1 uVar1;
  QWizardPage *pQVar2;
  
  pQVar2 = currentPage(this);
  if (pQVar2 != (QWizardPage *)0x0) {
    uVar1 = (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1b0))(pQVar2);
    return (bool)uVar1;
  }
  return true;
}

Assistant:

bool QWizard::validateCurrentPage()
{
    QWizardPage *page = currentPage();
    if (!page)
        return true;

    return page->validatePage();
}